

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t roaring64_bitmap_portable_size_in_bytes(roaring64_bitmap_t *r)

{
  leaf_t leaf_00;
  uint64_t uVar1;
  size_t sVar2;
  roaring_array_t *ra;
  bool bVar3;
  leaf_t leaf;
  uint32_t containers_with_high32;
  art_iterator_t it2;
  uint32_t current_high32;
  roaring_bitmap_t *bitmap32;
  uint32_t prev_high32;
  art_iterator_t it;
  uint64_t high32_count;
  size_t size;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  uint8_t in_stack_fffffffffffffe7f;
  roaring64_bitmap_t *in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffe8c;
  art_t *in_stack_fffffffffffffe90;
  undefined1 local_150 [8];
  long local_148;
  int local_bc;
  roaring64_bitmap_t *local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  leaf_t *local_a0;
  size_t local_10;
  
  local_10 = 8;
  art_init_iterator(in_stack_fffffffffffffe90,SUB41(in_stack_fffffffffffffe8c >> 0x18,0));
  local_ac = 0;
  local_b8 = (roaring64_bitmap_t *)0x0;
  while (local_a0 != (leaf_t *)0x0) {
    uVar1 = combine_key((uint8_t *)in_stack_fffffffffffffe80,
                        CONCAT11(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe7e));
    local_bc = (int)(uVar1 >> 0x20);
    if ((local_b8 == (roaring64_bitmap_t *)0x0) || (local_ac != local_bc)) {
      if (local_b8 != (roaring64_bitmap_t *)0x0) {
        local_10 = local_10 + 4;
        sVar2 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x1414d4);
        local_10 = sVar2 + local_10;
        roaring_bitmap_free_without_containers((roaring_bitmap_t *)0x1414f1);
      }
      memcpy(local_150,local_a8,0x90);
      while( true ) {
        bVar3 = false;
        if (local_148 != 0) {
          uVar1 = combine_key((uint8_t *)in_stack_fffffffffffffe80,
                              CONCAT11(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe7e));
          bVar3 = (int)(uVar1 >> 0x20) == local_bc;
        }
        if (!bVar3) break;
        art_iterator_next((art_iterator_t *)0x14155b);
      }
      local_b8 = (roaring64_bitmap_t *)
                 roaring_bitmap_create_with_capacity(in_stack_fffffffffffffe8c);
      local_ac = local_bc;
    }
    leaf_00 = *local_a0;
    in_stack_fffffffffffffe8c =
         CONCAT22((short)((uint)local_bc >> 0x10),(short)in_stack_fffffffffffffe8c);
    in_stack_fffffffffffffe80 = local_b8;
    ra = (roaring_array_t *)
         get_container(local_b8,CONCAT17(in_stack_fffffffffffffe7f,
                                         CONCAT16(in_stack_fffffffffffffe7e,
                                                  in_stack_fffffffffffffe78)));
    get_typecode(leaf_00);
    ra_append(ra,(uint16_t)(in_stack_fffffffffffffe8c >> 0x10),in_stack_fffffffffffffe80,
              in_stack_fffffffffffffe7f);
    art_iterator_next((art_iterator_t *)0x1415f0);
  }
  if (local_b8 != (roaring64_bitmap_t *)0x0) {
    local_10 = local_10 + 4;
    sVar2 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x141621);
    local_10 = sVar2 + local_10;
    roaring_bitmap_free_without_containers((roaring_bitmap_t *)0x14163e);
  }
  return local_10;
}

Assistant:

size_t roaring64_bitmap_portable_size_in_bytes(const roaring64_bitmap_t *r) {
    // https://github.com/RoaringBitmap/RoaringFormatSpec#extension-for-64-bit-implementations
    size_t size = 0;

    // Write as uint64 the distinct number of "buckets", where a bucket is
    // defined as the most significant 32 bits of an element.
    uint64_t high32_count;
    size += sizeof(high32_count);

    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    uint32_t prev_high32 = 0;
    roaring_bitmap_t *bitmap32 = NULL;

    // Iterate through buckets ordered by increasing keys.
    while (it.value != NULL) {
        uint32_t current_high32 = (uint32_t)(combine_key(it.key, 0) >> 32);
        if (bitmap32 == NULL || prev_high32 != current_high32) {
            if (bitmap32 != NULL) {
                // Write as uint32 the most significant 32 bits of the
                // bucket.
                size += sizeof(prev_high32);

                // Write the 32-bit Roaring bitmaps representing the least
                // significant bits of a set of elements.
                size += roaring_bitmap_portable_size_in_bytes(bitmap32);
                roaring_bitmap_free_without_containers(bitmap32);
            }

            // Start a new 32-bit bitmap with the current high 32 bits.
            art_iterator_t it2 = it;
            uint32_t containers_with_high32 = 0;
            while (it2.value != NULL && (uint32_t)(combine_key(it2.key, 0) >>
                                                   32) == current_high32) {
                containers_with_high32++;
                art_iterator_next(&it2);
            }
            bitmap32 =
                roaring_bitmap_create_with_capacity(containers_with_high32);

            prev_high32 = current_high32;
        }
        leaf_t leaf = (leaf_t)*it.value;
        ra_append(&bitmap32->high_low_container,
                  (uint16_t)(current_high32 >> 16), get_container(r, leaf),
                  get_typecode(leaf));
        art_iterator_next(&it);
    }

    if (bitmap32 != NULL) {
        // Write as uint32 the most significant 32 bits of the bucket.
        size += sizeof(prev_high32);

        // Write the 32-bit Roaring bitmaps representing the least
        // significant bits of a set of elements.
        size += roaring_bitmap_portable_size_in_bytes(bitmap32);
        roaring_bitmap_free_without_containers(bitmap32);
    }

    return size;
}